

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ProgramStateCase::verify
          (ProgramStateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  int extraout_EAX;
  undefined7 extraout_var;
  undefined1 local_1a8 [384];
  int iVar4;
  
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (ctx[0x30] == (EVP_PKEY_CTX)0x0) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Fail, link status may only change as a result of linking or loading a program binary."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Link status changed");
  }
  if (*(long *)(ctx + 0x38) != *(long *)(sig + 0x28)) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Fail, reported link time changed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Link time changed");
  }
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (ctx + 0x10),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sig);
  iVar4 = (int)CONCAT71(extraout_var,bVar3);
  if (bVar3) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Fail, program infolog changed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Infolog changed");
    iVar4 = extraout_EAX;
  }
  return iVar4;
}

Assistant:

void ProgramStateCase::verify (glu::Program& program, const glu::ProgramInfo& reference)
{
	TestLog&				log			= m_testCtx.getLog();
	const glu::ProgramInfo&	programInfo	= program.getInfo();

	if (!programInfo.linkOk)
	{
		log << TestLog::Message << "Fail, link status may only change as a result of linking or loading a program binary." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Link status changed");
	}

	if (programInfo.linkTimeUs != reference.linkTimeUs)
	{
		log << TestLog::Message << "Fail, reported link time changed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Link time changed");
	}

	if (programInfo.infoLog != reference.infoLog)
	{
		log << TestLog::Message << "Fail, program infolog changed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Infolog changed");
	}
}